

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::get_cover_probabilities
               (cb_explore *data,single_learner *param_2,example *ec,
               v_array<ACTION_SCORE::action_score> *probs)

{
  action_score *paVar1;
  float *pfVar2;
  v_array<ACTION_SCORE::action_score> *in_RCX;
  long in_RDX;
  long in_RDI;
  float fVar3;
  float fVar4;
  __type_conflict _Var5;
  float fVar6;
  float min_prob;
  uint32_t num_actions;
  uint32_t pred;
  size_t i_1;
  uint32_t i;
  float additive_probability;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar7;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float fVar8;
  learner<CB_EXPLORE::cb_explore,_example> *in_stack_ffffffffffffff90;
  uint uVar9;
  float in_stack_ffffffffffffffc0;
  undefined1 update_zero_elements;
  float in_stack_ffffffffffffffc4;
  ulong local_38;
  uint local_28;
  
  fVar6 = (float)(long)*(ulong *)(in_RDI + 0x120);
  fVar8 = (float)*(ulong *)(in_RDI + 0x120);
  fVar3 = 1.0 / fVar8;
  v_array<unsigned_int>::clear
            ((v_array<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  for (local_28 = 0; local_28 < *(uint *)(in_RDI + 0x10); local_28 = local_28 + 1) {
    v_array<ACTION_SCORE::action_score>::push_back
              ((v_array<ACTION_SCORE::action_score> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (action_score *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  for (local_38 = 0; update_zero_elements = (undefined1)((uint)in_stack_ffffffffffffffc0 >> 0x18),
      local_38 < *(ulong *)(in_RDI + 0x120); local_38 = local_38 + 1) {
    if (local_38 == 0) {
      LEARNER::learner<CB_EXPLORE::cb_explore,_example>::predict
                (in_stack_ffffffffffffff90,(example *)CONCAT44(fVar8,fVar6),
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    else {
      LEARNER::learner<CB_EXPLORE::cb_explore,_example>::predict
                (in_stack_ffffffffffffff90,(example *)CONCAT44(fVar8,fVar6),
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    in_stack_ffffffffffffffc0 = *(float *)(in_RDX + 0x6850);
    in_stack_ffffffffffffff84 = fVar3;
    paVar1 = v_array<ACTION_SCORE::action_score>::operator[]
                       (in_RCX,(ulong)((int)in_stack_ffffffffffffffc0 - 1));
    paVar1->score = in_stack_ffffffffffffff84 + paVar1->score;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  uVar9 = *(uint *)(in_RDI + 0x10);
  fVar7 = 1.0;
  fVar4 = 1.0 / (float)uVar9;
  _Var5 = std::sqrt<unsigned_long>(0x2f8c7f);
  fVar7 = fVar7 / (float)_Var5;
  pfVar2 = std::min<float>((float *)&stack0xffffffffffffffb4,(float *)&stack0xffffffffffffffb0);
  fVar3 = *pfVar2;
  ACTION_SCORE::begin_scores((action_scores *)CONCAT44(fVar8,fVar6));
  ACTION_SCORE::end_scores((action_scores *)CONCAT44(fVar8,fVar6));
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (in_stack_ffffffffffffffc4,(bool)update_zero_elements,
             (score_iterator *)CONCAT44(uVar9,fVar3),(score_iterator *)CONCAT44(fVar4,fVar7));
  *(long *)(in_RDI + 0x130) = *(long *)(in_RDI + 0x130) + 1;
  return;
}

Assistant:

void get_cover_probabilities(cb_explore& data, single_learner& /* base */, example& ec, v_array<action_score>& probs)
{
  float additive_probability = 1.f / (float)data.cover_size;
  data.preds.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});

  for (size_t i = 0; i < data.cover_size; i++)
  {
    // get predicted cost-sensitive predictions
    if (i == 0)
      data.cs->predict(ec, i);
    else
      data.cs->predict(ec, i + 1);
    uint32_t pred = ec.pred.multiclass;
    probs[pred - 1].score += additive_probability;
    data.preds.push_back((uint32_t)pred);
  }
  uint32_t num_actions = data.cbcs.num_actions;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));

  enforce_minimum_probability(min_prob * num_actions, false, begin_scores(probs), end_scores(probs));

  data.counter++;
}